

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::Builder::sortObjectIndexShort
          (Builder *this,uint8_t *objBase,iterator indexStart,iterator indexEnd)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_RCX;
  anon_class_8_1_205e0748 in_RSI;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_RDI;
  
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,arangodb::velocypack::Builder::sortObjectIndexShort(unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>)const::__0>
            (in_RCX,in_RDI,in_RSI);
  return;
}

Assistant:

void Builder::sortObjectIndexShort(
    uint8_t* objBase, std::vector<ValueLength>::iterator indexStart,
    std::vector<ValueLength>::iterator indexEnd) const {
  std::sort(indexStart, indexEnd,
            [objBase](ValueLength const& a, ValueLength const& b) {
              uint8_t const* aa = objBase + a;
              uint8_t const* bb = objBase + b;
              if (*aa >= 0x40 && *aa <= 0xbe && *bb >= 0x40 && *bb <= 0xbe) {
                // The fast path, short strings:
                uint8_t m = (std::min)(*aa - 0x40, *bb - 0x40);
                int c = std::memcmp(aa + 1, bb + 1, checkOverflow(m));
                return (c < 0 || (c == 0 && *aa < *bb));
              } else {
                uint64_t lena;
                uint64_t lenb;
                aa = findAttrName(aa, lena);
                bb = findAttrName(bb, lenb);
                uint64_t m = (std::min)(lena, lenb);
                int c = std::memcmp(aa, bb, checkOverflow(m));
                return (c < 0 || (c == 0 && lena < lenb));
              }
            });
}